

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvn.cc
# Opt level: O2

void __thiscall klogic::mvn::mvn(mvn *this,int k,int N)

{
  int iVar1;
  int iVar2;
  pointer pcVar3;
  undefined1 auVar4 [16];
  allocator_type local_19;
  
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            (&this->weights,(long)(N + 1),&local_19);
  if (-1 < (N | k)) {
    this->k = k;
    for (pcVar3 = (this->weights).
                  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pcVar3 != (this->weights).
                  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish; pcVar3 = pcVar3 + 1) {
      iVar1 = rand();
      iVar2 = rand();
      auVar4._0_8_ = (double)iVar1;
      auVar4._8_8_ = (double)iVar2;
      auVar4 = divpd(auVar4,_DAT_00105240);
      *(undefined1 (*) [16])pcVar3->_M_value = auVar4;
    }
    return;
  }
  __assert_fail("k >= 0 && N >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/be9[P]mlmvn/lib/mvn.cc",10
                ,"klogic::mvn::mvn(int, int)");
}

Assistant:

klogic::mvn::mvn(int k, int N)
    : weights(N + 1)
{
    assert(k >= 0 && N >= 0);
    this->k = k;

    // Randomize weights
    for (cvector::iterator i = weights.begin(); i != weights.end(); ++i)
        *i = cmplx(double(rand()) / RAND_MAX, double(rand()) / RAND_MAX);
}